

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O1

void __thiscall
duckdb::IEJoinUnion::IEJoinUnion
          (IEJoinUnion *this,ClientContext *context,PhysicalIEJoin *op,SortedTable *t1,idx_t b1,
          SortedTable *t2,idx_t b2)

{
  unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
  *this_01;
  SBScanState *this_02;
  SBScanState *this_03;
  SBIterator *pSVar1;
  pointer plVar2;
  pointer puVar3;
  __int_type _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Expression *pEVar6;
  pointer pLVar7;
  pointer pLVar8;
  ClientContext *context_00;
  int iVar9;
  const_reference pvVar10;
  pointer pSVar11;
  reference pvVar12;
  pointer pRVar13;
  const_reference pvVar14;
  ulong uVar15;
  type pSVar16;
  const_reference pvVar17;
  const_reference pvVar18;
  pointer pEVar19;
  BoundReferenceExpression *this_04;
  BoundConstantExpression *pBVar20;
  GlobalSortedTable *pGVar21;
  type pEVar22;
  type pBVar23;
  type pGVar24;
  pointer pGVar25;
  SBIterator *pSVar26;
  _Head_base<0UL,_duckdb::BoundReferenceExpression_*,_false> this_05;
  reference pvVar27;
  type marked;
  long base_00;
  idx_t iVar28;
  pointer __p_2;
  idx_t block_idx;
  pointer __p;
  ulong uVar29;
  LogicalType *this_06;
  idx_t base;
  unsigned_long val;
  templated_unique_single_t ref;
  vector<duckdb::LogicalType,_true> types;
  templated_unique_single_t from_left;
  templated_unique_single_t right_const;
  templated_unique_single_t left_const;
  ExpressionExecutor executor;
  vector<duckdb::BoundOrderByNode,_true> orders;
  ExpressionExecutor r_executor;
  ExpressionExecutor l_executor;
  SBIterator bounds1;
  RowLayout payload_layout;
  SBIterator bounds2;
  _Head_base<0UL,_duckdb::BoundReferenceExpression_*,_false> local_470;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_468;
  SortedTable *local_448;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_440;
  vector<unsigned_long,_true> *local_438;
  default_delete<duckdb::SBIterator> *local_430;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_428;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_420;
  ExpressionExecutor local_418;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> local_3c8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_3b0;
  const_reference local_3a8;
  idx_t local_3a0;
  default_delete<duckdb::SBIterator> *local_398;
  default_delete<duckdb::SBIterator> *local_390;
  vector<unsigned_long,_true> *local_388;
  default_delete<duckdb::SBIterator> *local_380;
  Value local_378;
  const_reference local_338;
  vector<duckdb::JoinCondition,_true> *local_330;
  SortedTable *local_328;
  ClientContext *local_320;
  ExpressionExecutor local_318;
  ExpressionExecutor local_2d0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_288;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_270;
  SBIterator local_258;
  RowLayout local_170;
  SBIterator local_118;
  
  this_00 = &this->l2;
  local_388 = &this->bit_array;
  (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->bit_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
  (this->bit_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->bit_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->p).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->p).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->li).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (this->p).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->li).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->li).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->l1).
  super_unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PhysicalRangeJoin::GlobalSortedTable_*,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  .super__Head_base<0UL,_duckdb::PhysicalRangeJoin::GlobalSortedTable_*,_false> =
       (_Head_base<0UL,_duckdb::PhysicalRangeJoin::GlobalSortedTable_*,_false>)0x0;
  (this->l2).
  super_unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PhysicalRangeJoin::GlobalSortedTable_*,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  .super__Head_base<0UL,_duckdb::PhysicalRangeJoin::GlobalSortedTable_*,_false>._M_head_impl =
       (GlobalSortedTable *)0x0;
  (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  (this->bloom_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->bloom_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->bloom_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)0x0;
  (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  local_430 = (default_delete<duckdb::SBIterator> *)&this->op1;
  local_380 = (default_delete<duckdb::SBIterator> *)&this->off1;
  local_390 = (default_delete<duckdb::SBIterator> *)&this->op2;
  local_398 = (default_delete<duckdb::SBIterator> *)&this->off2;
  this->n = 0;
  this->i = 0;
  (this->op1).super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
  super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl = (SBIterator *)0x0;
  (this->off1).super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
  super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl = (SBIterator *)0x0;
  (this->op2).super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
  super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl = (SBIterator *)0x0;
  (this->off2).super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
  super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl = (SBIterator *)0x0;
  local_448 = t1;
  pvVar10 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::operator[](&(t1->global_sort_state).sorted_blocks,0);
  pSVar11 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
            operator->(pvVar10);
  pvVar12 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
            ::operator[](&pSVar11->radix_sorting_data,b1);
  pRVar13 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
            operator->(pvVar12);
  if (pRVar13->count != 0) {
    this_01 = &(t2->global_sort_state).sorted_blocks;
    pvVar10 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
              ::operator[](this_01,0);
    pSVar11 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
              operator->(pvVar10);
    pvVar12 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
              ::operator[](&pSVar11->radix_sorting_data,b2);
    pRVar13 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
              operator->(pvVar12);
    if (pRVar13->count != 0) {
      local_330 = &(op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions;
      local_438 = &this->bloom_array;
      local_3a0 = b1;
      pvVar14 = vector<duckdb::JoinCondition,_true>::operator[](local_330,0);
      SBIterator::SBIterator(&local_258,&local_448->global_sort_state,pvVar14->comparison,0);
      local_3a8 = pvVar14;
      local_328 = t2;
      local_320 = context;
      SBIterator::SBIterator(&local_118,&t2->global_sort_state,pvVar14->comparison,0);
      this_02 = &local_258.scan;
      uVar29 = local_258.block_capacity * local_3a0;
      uVar15 = uVar29 / local_258.block_capacity;
      if ((uVar15 != local_258.scan.block_idx) &&
         (SBScanState::SetIndices(this_02,uVar15,0), uVar15 < local_258.block_count)) {
        SBScanState::PinRadix(this_02,local_258.scan.block_idx);
        local_258.block_ptr = SBScanState::RadixPtr(this_02);
        if (local_258.all_constant == false) {
          pSVar16 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                    operator*(&(local_258.scan.sb)->blob_sorting_data);
          SBScanState::PinData(this_02,pSVar16);
        }
      }
      iVar28 = local_118.block_capacity;
      local_258.scan.entry_idx = uVar29 % local_258.block_capacity;
      local_258.entry_ptr = local_258.block_ptr + local_258.scan.entry_idx * local_258.entry_size;
      local_258.entry_idx = uVar29;
      pvVar10 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
                ::operator[](this_01,0);
      pSVar11 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
                operator->(pvVar10);
      pvVar12 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                ::operator[](&pSVar11->radix_sorting_data,b2);
      pRVar13 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator->(pvVar12);
      uVar29 = (iVar28 * b2 + pRVar13->count) - 1;
      this_03 = &local_118.scan;
      uVar15 = uVar29 / local_118.block_capacity;
      if ((uVar15 != local_118.scan.block_idx) &&
         (SBScanState::SetIndices(this_03,uVar15,0), uVar15 < local_118.block_count)) {
        SBScanState::PinRadix(this_03,local_118.scan.block_idx);
        local_118.block_ptr = SBScanState::RadixPtr(this_03);
        if (local_118.all_constant == false) {
          pSVar16 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                    operator*(&(local_118.scan.sb)->blob_sorting_data);
          SBScanState::PinData(this_03,pSVar16);
        }
      }
      local_118.scan.entry_idx = uVar29 % local_118.block_capacity;
      local_118.entry_ptr = local_118.block_ptr + local_118.scan.entry_idx * local_118.entry_size;
      local_118.entry_idx = uVar29;
      if (local_258.all_constant == true) {
        iVar9 = FastMemcmp(local_258.entry_ptr,local_118.entry_ptr,
                           (local_258.sort_layout)->comparison_size);
      }
      else {
        iVar9 = Comparators::CompareTuple
                          (this_02,this_03,&local_258.entry_ptr,&local_118.entry_ptr,
                           local_258.sort_layout,&local_258.external);
      }
      context_00 = local_320;
      if (iVar9 <= local_258.cmp) {
        pvVar17 = vector<duckdb::BoundOrderByNode,_true>::operator[](&op->lhs_orders,0);
        pvVar18 = vector<duckdb::BoundOrderByNode,_true>::operator[](&op->lhs_orders,1);
        local_468.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (LogicalType *)0x0;
        local_468.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish = (LogicalType *)0x0;
        local_468.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3b0 = &pvVar18->expression;
        pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(local_3b0);
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalType&>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_468,
                   &pEVar19->return_type);
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalTypeId_const&>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_468,
                   &LogicalType::BIGINT);
        RowLayout::RowLayout(&local_170);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_270,&local_468);
        local_338 = pvVar18;
        RowLayout::Initialize(&local_170,(vector<duckdb::LogicalType,_true> *)&local_270,true);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_270);
        pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(&pvVar17->expression);
        this_04 = (BoundReferenceExpression *)operator_new(0x60);
        LogicalType::LogicalType((LogicalType *)&local_2d0,&pEVar19->return_type);
        BoundReferenceExpression::BoundReferenceExpression(this_04,(LogicalType *)&local_2d0,0);
        local_470._M_head_impl = this_04;
        LogicalType::~LogicalType((LogicalType *)&local_2d0);
        local_3c8.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3c8.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3c8.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
        emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&,duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                  ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                   &local_3c8,&pvVar17->type,&pvVar17->null_order,
                   (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                    *)&local_470);
        Value::BOOLEAN((Value *)&local_318,true);
        pvVar14 = local_3a8;
        pBVar20 = (BoundConstantExpression *)operator_new(0x98);
        Value::Value((Value *)&local_2d0,(Value *)&local_318);
        BoundConstantExpression::BoundConstantExpression(pBVar20,(Value *)&local_2d0);
        local_440._M_head_impl = pBVar20;
        Value::~Value((Value *)&local_2d0);
        Value::~Value((Value *)&local_318);
        iVar9 = SBIterator::ComparisonValue(pvVar14->comparison);
        local_2d0.expressions.
        super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start._0_1_ = iVar9 == 0 | 2;
        local_318.expressions.
        super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
        ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
        emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                  ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                   &local_3c8,(OrderType *)&local_2d0,(OrderByNullType *)&local_318,
                   (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                    *)&local_440);
        pGVar21 = (GlobalSortedTable *)operator_new(0x2e0);
        PhysicalRangeJoin::GlobalSortedTable::GlobalSortedTable
                  (pGVar21,context_00,(vector<duckdb::BoundOrderByNode,_true> *)&local_3c8,
                   &local_170,(PhysicalOperator *)op);
        ::std::
        __uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
        ::reset((__uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
                 *)this,pGVar21);
        ExpressionExecutor::ExpressionExecutor(&local_2d0,context_00);
        pEVar22 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(&pvVar17->expression);
        ExpressionExecutor::AddExpression(&local_2d0,pEVar22);
        Value::BOOLEAN((Value *)&local_418,true);
        pBVar20 = (BoundConstantExpression *)operator_new(0x98);
        Value::Value((Value *)&local_318,(Value *)&local_418);
        BoundConstantExpression::BoundConstantExpression(pBVar20,(Value *)&local_318);
        local_420._M_head_impl = pBVar20;
        Value::~Value((Value *)&local_318);
        Value::~Value((Value *)&local_418);
        pBVar23 = unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                  ::operator*((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                               *)&local_420);
        ExpressionExecutor::AddExpression(&local_2d0,&pBVar23->super_Expression);
        pEVar22 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(local_3b0);
        ExpressionExecutor::AddExpression(&local_2d0,pEVar22);
        pGVar24 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                  ::operator*(&this->l1);
        AppendKey(local_448,&local_2d0,pGVar24,1,1,local_3a0);
        ExpressionExecutor::ExpressionExecutor(&local_318,context_00);
        pvVar17 = vector<duckdb::BoundOrderByNode,_true>::operator[](&op->rhs_orders,0);
        pEVar22 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(&pvVar17->expression);
        ExpressionExecutor::AddExpression(&local_318,pEVar22);
        Value::BOOLEAN(&local_378,false);
        pBVar20 = (BoundConstantExpression *)operator_new(0x98);
        Value::Value((Value *)&local_418,&local_378);
        BoundConstantExpression::BoundConstantExpression(pBVar20,(Value *)&local_418);
        local_428._M_head_impl = pBVar20;
        Value::~Value((Value *)&local_418);
        Value::~Value(&local_378);
        pBVar23 = unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                  ::operator*((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                               *)&local_428);
        pvVar14 = local_3a8;
        ExpressionExecutor::AddExpression(&local_318,&pBVar23->super_Expression);
        pvVar17 = vector<duckdb::BoundOrderByNode,_true>::operator[](&op->rhs_orders,1);
        pEVar22 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(&pvVar17->expression);
        ExpressionExecutor::AddExpression(&local_318,pEVar22);
        pGVar24 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                  ::operator*(&this->l1);
        AppendKey(local_328,&local_318,pGVar24,-1,-1,b2);
        pGVar25 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                  ::operator->(&this->l1);
        if ((pGVar25->global_sort_state).sorted_blocks.
            super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pGVar25->global_sort_state).sorted_blocks.
            super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pGVar24 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator*(&this->l1);
          Sort(pGVar24);
          pGVar25 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator->(&this->l1);
          pSVar26 = (SBIterator *)operator_new(0xe8);
          SBIterator::SBIterator(pSVar26,&pGVar25->global_sort_state,pvVar14->comparison,0);
          local_418.expressions.
          super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
          super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          pSVar1 = *(SBIterator **)local_430;
          *(SBIterator **)local_430 = pSVar26;
          if (pSVar1 != (SBIterator *)0x0) {
            ::std::default_delete<duckdb::SBIterator>::operator()(local_430,pSVar1);
          }
          if ((SBIterator *)
              local_418.expressions.
              super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
              super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (SBIterator *)0x0) {
            ::std::default_delete<duckdb::SBIterator>::operator()
                      ((default_delete<duckdb::SBIterator> *)&local_418,
                       (SBIterator *)
                       local_418.expressions.
                       super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                       .
                       super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
          pGVar25 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator->(&this->l1);
          pSVar26 = (SBIterator *)operator_new(0xe8);
          SBIterator::SBIterator(pSVar26,&pGVar25->global_sort_state,pvVar14->comparison,0);
          local_418.expressions.
          super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
          super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          pSVar1 = *(SBIterator **)local_380;
          *(SBIterator **)local_380 = pSVar26;
          if (pSVar1 != (SBIterator *)0x0) {
            ::std::default_delete<duckdb::SBIterator>::operator()(local_380,pSVar1);
          }
          if ((SBIterator *)
              local_418.expressions.
              super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
              super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (SBIterator *)0x0) {
            ::std::default_delete<duckdb::SBIterator>::operator()
                      ((default_delete<duckdb::SBIterator> *)&local_418,
                       (SBIterator *)
                       local_418.expressions.
                       super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                       .
                       super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
          pGVar24 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator*(&this->l1);
          ExtractColumn<long>((vector<long,_true> *)&local_418,pGVar24,
                              ((long)local_468.
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_468.
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555 - 1);
          plVar2 = (this->li).super_vector<long,_std::allocator<long>_>.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          (this->li).super_vector<long,_std::allocator<long>_>.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
               (pointer)local_418.expressions.
                        super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                        .
                        super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          (this->li).super_vector<long,_std::allocator<long>_>.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
               = (pointer)local_418.expressions.
                          super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                          .
                          super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
          (this->li).super_vector<long,_std::allocator<long>_>.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               (pointer)local_418.expressions.
                        super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                        .
                        super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_418.expressions.
          super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
          super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_418.expressions.
          super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
          super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_418.expressions.
          super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
          super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (plVar2 != (pointer)0x0) {
            operator_delete(plVar2);
          }
          if (local_418.expressions.
              super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
              super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_418.expressions.
                            super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                            .
                            super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          pLVar8 = local_468.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pLVar7 = local_468.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          this_06 = local_468.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (local_468.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_468.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start) {
            do {
              LogicalType::~LogicalType(this_06);
              this_06 = this_06 + 1;
            } while (this_06 != pLVar8);
            local_468.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_finish = pLVar7;
          }
          ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
          emplace_back<duckdb::LogicalTypeId_const&>
                    ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_468,
                     &LogicalType::BIGINT);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_288,&local_468);
          RowLayout::Initialize(&local_170,(vector<duckdb::LogicalType,_true> *)&local_288,true);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_288);
          ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
          _M_erase_at_end(&local_3c8,
                          local_3c8.
                          super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
          pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(local_3b0);
          this_05._M_head_impl = (BoundReferenceExpression *)operator_new(0x60);
          LogicalType::LogicalType((LogicalType *)&local_418,&pEVar19->return_type);
          BoundReferenceExpression::BoundReferenceExpression
                    (this_05._M_head_impl,(LogicalType *)&local_418,0);
          pvVar17 = local_338;
          LogicalType::~LogicalType((LogicalType *)&local_418);
          if (local_470._M_head_impl != (BoundReferenceExpression *)0x0) {
            pEVar6 = &(local_470._M_head_impl)->super_Expression;
            local_470._M_head_impl = this_05._M_head_impl;
            (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[1])();
            this_05._M_head_impl = local_470._M_head_impl;
          }
          local_470._M_head_impl = this_05._M_head_impl;
          ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
          emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&,duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                    ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                     &local_3c8,&pvVar17->type,&pvVar17->null_order,
                     (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                      *)&local_470);
          ExpressionExecutor::ExpressionExecutor(&local_418,context_00);
          pvVar27 = vector<duckdb::BoundOrderByNode,_true>::operator[]
                              ((vector<duckdb::BoundOrderByNode,_true> *)&local_3c8,0);
          pEVar22 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(&pvVar27->expression);
          ExpressionExecutor::AddExpression(&local_418,pEVar22);
          pGVar21 = (GlobalSortedTable *)operator_new(0x2e0);
          PhysicalRangeJoin::GlobalSortedTable::GlobalSortedTable
                    (pGVar21,context_00,(vector<duckdb::BoundOrderByNode,_true> *)&local_3c8,
                     &local_170,(PhysicalOperator *)op);
          local_448 = (SortedTable *)&this->i;
          ::std::
          __uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
          ::reset((__uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
                   *)this_00,pGVar21);
          val = 0;
          uVar15 = 0;
          while( true ) {
            pGVar25 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                      ::operator->(&this->l1);
            if ((pGVar25->global_sort_state).sorted_blocks.
                super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (pGVar25->global_sort_state).sorted_blocks.
                super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              uVar29 = 0;
            }
            else {
              pvVar10 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
                        ::operator[](&(pGVar25->global_sort_state).sorted_blocks,0);
              pSVar11 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>
                        ::operator->(pvVar10);
              uVar29 = (long)(pSVar11->radix_sorting_data).
                             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pSVar11->radix_sorting_data).
                             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3;
            }
            if (uVar29 <= uVar15) break;
            pGVar24 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                      ::operator*(&this->l1);
            marked = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                     ::operator*(this_00);
            base_00 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
            iVar28 = AppendKey(pGVar24,&local_418,marked,1,base_00,uVar15);
            val = val + iVar28;
            uVar15 = uVar15 + 1;
          }
          pGVar24 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator*(this_00);
          Sort(pGVar24);
          pGVar24 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator*(this_00);
          ExtractColumn<unsigned_long>
                    ((vector<unsigned_long,_true> *)&local_378,pGVar24,
                     ((long)local_468.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_468.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
                     1);
          puVar3 = (this->p).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          (this->p).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_378.type_._0_8_;
          (this->p).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)local_378.type_.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          (this->p).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_378.type_.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          local_378.type_._0_8_ = (void *)0x0;
          local_378.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_378.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (puVar3 != (pointer)0x0) {
            operator_delete(puVar3);
          }
          if ((void *)local_378.type_._0_8_ != (void *)0x0) {
            operator_delete((void *)local_378.type_._0_8_);
          }
          pGVar25 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator->(this_00);
          _Var4 = (pGVar25->count).super___atomic_base<unsigned_long>._M_i;
          this->n = _Var4;
          local_378.type_.id_ = INVALID;
          local_378.type_.physical_type_ = ~INVALID;
          local_378.type_._2_6_ = 0;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    (&local_388->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                     _Var4 + 0x3f >> 6,(value_type_conflict *)&local_378);
          puVar3 = (this->bit_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          p_Var5 = (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          iVar28 = this->n;
          (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
          (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar3;
          (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.capacity = iVar28;
          uVar15 = this->n + 0x3ff >> 10;
          this->bloom_count = uVar15;
          local_378.type_.id_ = INVALID;
          local_378.type_.physical_type_ = ~INVALID;
          local_378.type_._2_6_ = 0;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    (&local_438->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                     uVar15 + 0x3f >> 6,(value_type_conflict *)&local_378);
          iVar28 = this->bloom_count;
          puVar3 = (this->bloom_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          p_Var5 = (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
          (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar3;
          (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.capacity = iVar28;
          pvVar14 = vector<duckdb::JoinCondition,_true>::operator[](local_330,1);
          pGVar25 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator->(this_00);
          pSVar26 = (SBIterator *)operator_new(0xe8);
          SBIterator::SBIterator(pSVar26,&pGVar25->global_sort_state,pvVar14->comparison,0);
          local_378.type_._0_8_ = (SBIterator *)0x0;
          pSVar1 = *(SBIterator **)local_390;
          *(SBIterator **)local_390 = pSVar26;
          if (pSVar1 != (SBIterator *)0x0) {
            ::std::default_delete<duckdb::SBIterator>::operator()(local_390,pSVar1);
          }
          if ((SBIterator *)local_378.type_._0_8_ != (SBIterator *)0x0) {
            ::std::default_delete<duckdb::SBIterator>::operator()
                      ((default_delete<duckdb::SBIterator> *)&local_378,
                       (SBIterator *)local_378.type_._0_8_);
          }
          pGVar25 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator->(this_00);
          pSVar26 = (SBIterator *)operator_new(0xe8);
          SBIterator::SBIterator(pSVar26,&pGVar25->global_sort_state,pvVar14->comparison,0);
          local_378.type_._0_8_ = (SBIterator *)0x0;
          pSVar1 = *(SBIterator **)local_398;
          *(SBIterator **)local_398 = pSVar26;
          if (pSVar1 != (SBIterator *)0x0) {
            ::std::default_delete<duckdb::SBIterator>::operator()(local_398,pSVar1);
          }
          if ((SBIterator *)local_378.type_._0_8_ != (SBIterator *)0x0) {
            ::std::default_delete<duckdb::SBIterator>::operator()
                      ((default_delete<duckdb::SBIterator> *)&local_378,
                       (SBIterator *)local_378.type_._0_8_);
          }
          local_448->op = (PhysicalOperator *)0x0;
          (local_448->global_sort_state).context = (ClientContext *)0x0;
          NextRow(this);
          ::std::
          vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
          ::~vector(&local_418.states.
                     super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
                   );
          if (local_418.expressions.
              super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
              super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_418.expressions.
                            super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                            .
                            super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_428._M_head_impl != (BoundConstantExpression *)0x0) {
          (*((local_428._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression
            [1])();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
        ::~vector(&local_318.states.
                   super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
                 );
        if ((void *)CONCAT71(local_318.expressions.
                             super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                             .
                             super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_318.expressions.
                             super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                             .
                             super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
          operator_delete((void *)CONCAT71(local_318.expressions.
                                           super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                           .
                                           super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                           local_318.expressions.
                                           super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                           .
                                           super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_1_));
        }
        if (local_420._M_head_impl != (BoundConstantExpression *)0x0) {
          (*((local_420._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression
            [1])();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
        ::~vector(&local_2d0.states.
                   super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
                 );
        if ((void *)CONCAT71(local_2d0.expressions.
                             super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                             .
                             super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             (byte)local_2d0.expressions.
                                   super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                   .
                                   super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
          operator_delete((void *)CONCAT71(local_2d0.expressions.
                                           super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                           .
                                           super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                           (byte)local_2d0.expressions.
                                                 super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                                 .
                                                 super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start));
        }
        if (local_440._M_head_impl != (BoundConstantExpression *)0x0) {
          (*((local_440._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression
            [1])();
        }
        ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
                  (&local_3c8);
        if (local_470._M_head_impl != (BoundReferenceExpression *)0x0) {
          (*((local_470._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression
            [1])();
        }
        if (local_170.offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.offsets.
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_170);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_468);
      }
      BufferHandle::~BufferHandle(&local_118.scan.payload_heap_handle);
      BufferHandle::~BufferHandle(&local_118.scan.payload_data_handle);
      BufferHandle::~BufferHandle(&local_118.scan.blob_sorting_heap_handle);
      BufferHandle::~BufferHandle(&local_118.scan.blob_sorting_data_handle);
      BufferHandle::~BufferHandle(&local_118.scan.radix_handle);
      BufferHandle::~BufferHandle(&local_258.scan.payload_heap_handle);
      BufferHandle::~BufferHandle(&local_258.scan.payload_data_handle);
      BufferHandle::~BufferHandle(&local_258.scan.blob_sorting_heap_handle);
      BufferHandle::~BufferHandle(&local_258.scan.blob_sorting_data_handle);
      BufferHandle::~BufferHandle(&local_258.scan.radix_handle);
    }
  }
  return;
}

Assistant:

IEJoinUnion::IEJoinUnion(ClientContext &context, const PhysicalIEJoin &op, SortedTable &t1, const idx_t b1,
                         SortedTable &t2, const idx_t b2)
    : n(0), i(0) {
	// input : query Q with 2 join predicates t1.X op1 t2.X' and t1.Y op2 t2.Y', tables T, T' of sizes m and n resp.
	// output: a list of tuple pairs (ti , tj)
	// Note that T/T' are already sorted on X/X' and contain the payload data
	// We only join the two block numbers and use the sizes of the blocks as the counts

	// 0. Filter out tables with no overlap
	if (!t1.BlockSize(b1) || !t2.BlockSize(b2)) {
		return;
	}

	const auto &cmp1 = op.conditions[0].comparison;
	SBIterator bounds1(t1.global_sort_state, cmp1);
	SBIterator bounds2(t2.global_sort_state, cmp1);

	// t1.X[0] op1 t2.X'[-1]
	bounds1.SetIndex(bounds1.block_capacity * b1);
	bounds2.SetIndex(bounds2.block_capacity * b2 + t2.BlockSize(b2) - 1);
	if (!bounds1.Compare(bounds2)) {
		return;
	}

	// 1. let L1 (resp. L2) be the array of column X (resp. Y )
	const auto &order1 = op.lhs_orders[0];
	const auto &order2 = op.lhs_orders[1];

	// 2. if (op1 ∈ {>, ≥}) sort L1 in descending order
	// 3. else if (op1 ∈ {<, ≤}) sort L1 in ascending order

	// For the union algorithm, we make a unified table with the keys and the rids as the payload:
	//		X/X', Y/Y', R/R'/Li
	// The first position is the sort key.
	vector<LogicalType> types;
	types.emplace_back(order2.expression->return_type);
	types.emplace_back(LogicalType::BIGINT);
	RowLayout payload_layout;
	payload_layout.Initialize(types);

	// Sort on the first expression
	auto ref = make_uniq<BoundReferenceExpression>(order1.expression->return_type, 0U);
	vector<BoundOrderByNode> orders;
	orders.emplace_back(order1.type, order1.null_order, std::move(ref));
	// The goal is to make i (from the left table) < j (from the right table),
	// if value[i] and value[j] match the condition 1.
	// Add a column from_left to solve the problem when there exist multiple equal values in l1.
	// If the operator is loose inequality, make t1.from_left (== true) sort BEFORE t2.from_left (== false).
	// Otherwise, make t1.from_left sort (== true) sort AFTER t2.from_left (== false).
	// For example, if t1.time <= t2.time
	// | value     | 1     | 1     | 1     | 1     |
	// | --------- | ----- | ----- | ----- | ----- |
	// | from_left | T(l2) | T(l2) | F(r1) | F(r2) |
	// if t1.time < t2.time
	// | value     | 1     | 1     | 1     | 1     |
	// | --------- | ----- | ----- | ----- | ----- |
	// | from_left | F(r2) | F(r1) | T(l2) | T(l1) |
	// Using this OrderType, if i < j then value[i] (from left table) and value[j] (from right table) match
	// the condition (t1.time <= t2.time or t1.time < t2.time), then from_left will force them into the correct order.
	auto from_left = make_uniq<BoundConstantExpression>(Value::BOOLEAN(true));
	orders.emplace_back(SBIterator::ComparisonValue(cmp1) == 0 ? OrderType::DESCENDING : OrderType::ASCENDING,
	                    OrderByNullType::ORDER_DEFAULT, std::move(from_left));

	l1 = make_uniq<SortedTable>(context, orders, payload_layout, op);

	// LHS has positive rids
	ExpressionExecutor l_executor(context);
	l_executor.AddExpression(*order1.expression);
	// add const column true
	auto left_const = make_uniq<BoundConstantExpression>(Value::BOOLEAN(true));
	l_executor.AddExpression(*left_const);
	l_executor.AddExpression(*order2.expression);
	AppendKey(t1, l_executor, *l1, 1, 1, b1);

	// RHS has negative rids
	ExpressionExecutor r_executor(context);
	r_executor.AddExpression(*op.rhs_orders[0].expression);
	// add const column flase
	auto right_const = make_uniq<BoundConstantExpression>(Value::BOOLEAN(false));
	r_executor.AddExpression(*right_const);
	r_executor.AddExpression(*op.rhs_orders[1].expression);
	AppendKey(t2, r_executor, *l1, -1, -1, b2);

	if (l1->global_sort_state.sorted_blocks.empty()) {
		return;
	}

	Sort(*l1);

	op1 = make_uniq<SBIterator>(l1->global_sort_state, cmp1);
	off1 = make_uniq<SBIterator>(l1->global_sort_state, cmp1);

	// We don't actually need the L1 column, just its sort key, which is in the sort blocks
	li = ExtractColumn<int64_t>(*l1, types.size() - 1);

	// 4. if (op2 ∈ {>, ≥}) sort L2 in ascending order
	// 5. else if (op2 ∈ {<, ≤}) sort L2 in descending order

	// We sort on Y/Y' to obtain the sort keys and the permutation array.
	// For this we just need a two-column table of Y, P
	types.clear();
	types.emplace_back(LogicalType::BIGINT);
	payload_layout.Initialize(types);

	// Sort on the first expression
	orders.clear();
	ref = make_uniq<BoundReferenceExpression>(order2.expression->return_type, 0U);
	orders.emplace_back(order2.type, order2.null_order, std::move(ref));

	ExpressionExecutor executor(context);
	executor.AddExpression(*orders[0].expression);

	l2 = make_uniq<SortedTable>(context, orders, payload_layout, op);
	for (idx_t base = 0, block_idx = 0; block_idx < l1->BlockCount(); ++block_idx) {
		base += AppendKey(*l1, executor, *l2, 1, NumericCast<int64_t>(base), block_idx);
	}

	Sort(*l2);

	// We don't actually need the L2 column, just its sort key, which is in the sort blocks

	// 6. compute the permutation array P of L2 w.r.t. L1
	p = ExtractColumn<idx_t>(*l2, types.size() - 1);

	// 7. initialize bit-array B (|B| = n), and set all bits to 0
	n = l2->count.load();
	bit_array.resize(ValidityMask::EntryCount(n), 0);
	bit_mask.Initialize(bit_array.data(), n);

	// Bloom filter
	bloom_count = (n + (BLOOM_CHUNK_BITS - 1)) / BLOOM_CHUNK_BITS;
	bloom_array.resize(ValidityMask::EntryCount(bloom_count), 0);
	bloom_filter.Initialize(bloom_array.data(), bloom_count);

	// 11. for(i←1 to n) do
	const auto &cmp2 = op.conditions[1].comparison;
	op2 = make_uniq<SBIterator>(l2->global_sort_state, cmp2);
	off2 = make_uniq<SBIterator>(l2->global_sort_state, cmp2);
	i = 0;
	j = 0;
	(void)NextRow();
}